

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_credential.cc
# Opt level: O0

int SSL_CREDENTIAL_set_private_key_method(SSL_CREDENTIAL *cred,SSL_PRIVATE_KEY_METHOD *key_method)

{
  bool bVar1;
  SSL_PRIVATE_KEY_METHOD *key_method_local;
  SSL_CREDENTIAL *cred_local;
  
  bVar1 = ssl_credential_st::UsesPrivateKey(cred);
  if (bVar1) {
    std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::operator=(&cred->privkey,(nullptr_t)0x0);
    cred->key_method = key_method;
  }
  else {
    ERR_put_error(0x10,0,0x42,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_credential.cc"
                  ,0x16f);
  }
  cred_local._4_4_ = (uint)bVar1;
  return cred_local._4_4_;
}

Assistant:

int SSL_CREDENTIAL_set_private_key_method(
    SSL_CREDENTIAL *cred, const SSL_PRIVATE_KEY_METHOD *key_method) {
  if (!cred->UsesPrivateKey()) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return 0;
  }

  cred->privkey = nullptr;
  cred->key_method = key_method;
  return 1;
}